

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexTriangleAdjacency.cpp
# Opt level: O3

void __thiscall
Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
          (VertexTriangleAdjacency *this,aiFace *pcFaces,uint iNumFaces,uint iNumVertices,
          bool bComputeNumTriangles)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  aiFace *paVar4;
  uint *puVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  aiFace *paVar9;
  aiFace *pcFace;
  ulong __n;
  uint *puVar10;
  
  paVar9 = pcFaces + iNumFaces;
  if (iNumVertices == 0) {
    if (iNumFaces == 0) {
      iNumVertices = 0;
    }
    else {
      iNumVertices = 0;
      paVar4 = pcFaces;
      do {
        if (paVar4 == (aiFace *)0x0) {
          __assert_fail("nullptr != pcFace",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/VertexTriangleAdjacency.cpp"
                        ,0x3f,
                        "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                       );
        }
        if (paVar4->mNumIndices != 3) {
          __assert_fail("3 == pcFace->mNumIndices",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/VertexTriangleAdjacency.cpp"
                        ,0x40,
                        "Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *, unsigned int, unsigned int, bool)"
                       );
        }
        puVar10 = paVar4->mIndices;
        if (iNumVertices <= *puVar10) {
          iNumVertices = *puVar10;
        }
        if (iNumVertices <= puVar10[1]) {
          iNumVertices = puVar10[1];
        }
        if (iNumVertices <= puVar10[2]) {
          iNumVertices = puVar10[2];
        }
        paVar4 = paVar4 + 1;
      } while (paVar4 != paVar9);
    }
  }
  this->mNumVertices = iNumVertices;
  if (bComputeNumTriangles) {
    __n = (ulong)(iNumVertices + 1) << 2;
    puVar5 = (uint *)operator_new__(__n);
    this->mLiveTriangles = puVar5;
    memset(puVar5,0,__n);
    pvVar6 = operator_new__((ulong)(iNumVertices + 2) << 2);
    puVar10 = (uint *)((long)pvVar6 + 4);
  }
  else {
    pvVar6 = operator_new__((ulong)(iNumVertices + 2) << 2);
    puVar5 = (uint *)((long)pvVar6 + 4);
    memset(puVar5,0,(ulong)(iNumVertices + 1) << 2);
    this->mLiveTriangles = (uint *)0x0;
    puVar10 = puVar5;
  }
  this->mOffsetTable = puVar10;
  puVar5[iNumVertices] = 0;
  paVar4 = pcFaces;
  if (iNumFaces != 0) {
    do {
      uVar3 = paVar4->mNumIndices;
      if (uVar3 != 0) {
        puVar2 = paVar4->mIndices;
        puVar5[*puVar2] = puVar5[*puVar2] + 1;
        if ((uVar3 != 1) && (puVar5[puVar2[1]] = puVar5[puVar2[1]] + 1, 2 < uVar3)) {
          puVar5[puVar2[2]] = puVar5[puVar2[2]] + 1;
        }
      }
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar9);
  }
  lVar7 = 0;
  uVar3 = 0;
  do {
    uVar8 = *(int *)((long)puVar5 + lVar7) + uVar3;
    *(uint *)((long)puVar10 + lVar7) = uVar3;
    lVar7 = lVar7 + 4;
    uVar3 = uVar8;
  } while ((ulong)iNumVertices * 4 + 4 != lVar7);
  puVar5 = (uint *)operator_new__((ulong)uVar8 << 2);
  this->mAdjacencyTable = puVar5;
  if (iNumFaces != 0) {
    uVar3 = 0;
    do {
      uVar8 = pcFaces->mNumIndices;
      if (uVar8 != 0) {
        puVar5 = pcFaces->mIndices;
        puVar2 = this->mAdjacencyTable;
        uVar1 = puVar10[*puVar5];
        puVar10[*puVar5] = uVar1 + 1;
        puVar2[uVar1] = uVar3;
        if (uVar8 != 1) {
          puVar2 = this->mAdjacencyTable;
          uVar1 = puVar10[puVar5[1]];
          puVar10[puVar5[1]] = uVar1 + 1;
          puVar2[uVar1] = uVar3;
          if (2 < uVar8) {
            puVar2 = this->mAdjacencyTable;
            uVar8 = puVar10[puVar5[2]];
            puVar10[puVar5[2]] = uVar8 + 1;
            puVar2[uVar8] = uVar3;
          }
        }
      }
      pcFaces = pcFaces + 1;
      uVar3 = uVar3 + 1;
    } while (pcFaces != paVar9);
    puVar10 = this->mOffsetTable;
  }
  this->mOffsetTable = puVar10 + -1;
  puVar10[-1] = 0;
  return;
}

Assistant:

VertexTriangleAdjacency::VertexTriangleAdjacency(aiFace *pcFaces,
    unsigned int iNumFaces,
    unsigned int iNumVertices /*= 0*/,
    bool bComputeNumTriangles /*= false*/)
{
    // compute the number of referenced vertices if it wasn't specified by the caller
    const aiFace* const pcFaceEnd = pcFaces + iNumFaces;
    if (!iNumVertices)  {
        for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)   {
            ai_assert( nullptr != pcFace );
            ai_assert(3 == pcFace->mNumIndices);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[0]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[1]);
            iNumVertices = std::max(iNumVertices,pcFace->mIndices[2]);
        }
    }

    mNumVertices = iNumVertices;

    unsigned int* pi;

    // allocate storage
    if (bComputeNumTriangles)   {
        pi = mLiveTriangles = new unsigned int[iNumVertices+1];
        ::memset(mLiveTriangles,0,sizeof(unsigned int)*(iNumVertices+1));
        mOffsetTable = new unsigned int[iNumVertices+2]+1;
    } else {
        pi = mOffsetTable = new unsigned int[iNumVertices+2]+1;
        ::memset(mOffsetTable,0,sizeof(unsigned int)*(iNumVertices+1));
        mLiveTriangles = NULL; // important, otherwise the d'tor would crash
    }

    // get a pointer to the end of the buffer
    unsigned int* piEnd = pi+iNumVertices;
    *piEnd++ = 0u;

    // first pass: compute the number of faces referencing each vertex
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace)
    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;
        if (nind > 0) pi[ind[0]]++;
        if (nind > 1) pi[ind[1]]++;
        if (nind > 2) pi[ind[2]]++;
    }

    // second pass: compute the final offset table
    unsigned int iSum = 0;
    unsigned int* piCurOut = this->mOffsetTable;
    for (unsigned int* piCur = pi; piCur != piEnd;++piCur,++piCurOut)   {

        unsigned int iLastSum = iSum;
        iSum += *piCur;
        *piCurOut = iLastSum;
    }
    pi = this->mOffsetTable;

    // third pass: compute the final table
    this->mAdjacencyTable = new unsigned int[iSum];
    iSum = 0;
    for (aiFace* pcFace = pcFaces; pcFace != pcFaceEnd; ++pcFace,++iSum)    {
        unsigned nind = pcFace->mNumIndices;
        unsigned * ind = pcFace->mIndices;

        if (nind > 0) mAdjacencyTable[pi[ind[0]]++] = iSum;
        if (nind > 1) mAdjacencyTable[pi[ind[1]]++] = iSum;
        if (nind > 2) mAdjacencyTable[pi[ind[2]]++] = iSum;
    }
    // fourth pass: undo the offset computations made during the third pass
    // We could do this in a separate buffer, but this would be TIMES slower.
    --mOffsetTable;
    *mOffsetTable = 0u;
}